

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

string * __thiscall
llvm::sys::path::convert_to_slash_abi_cxx11_
          (string *__return_storage_ptr__,path *this,StringRef path,Style style)

{
  size_type sVar1;
  pointer pcVar2;
  size_type sVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)path.Length == 0) {
    if (this != (path *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,this,path.Data + (long)this);
      sVar1 = __return_storage_ptr__->_M_string_length;
      if (sVar1 == 0) {
        return __return_storage_ptr__;
      }
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      sVar3 = 0;
      do {
        if (pcVar2[sVar3] == '\\') {
          pcVar2[sVar3] = '/';
        }
        sVar3 = sVar3 + 1;
      } while (sVar1 != sVar3);
      return __return_storage_ptr__;
    }
  }
  else if (this != (path *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,this,path.Data + (long)this);
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string convert_to_slash(StringRef path, Style style) {
  if (real_style(style) != Style::windows)
    return path;

  std::string s = path.str();
  std::replace(s.begin(), s.end(), '\\', '/');
  return s;
}